

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.cpp
# Opt level: O1

void __thiscall embree::BVHN<4>::layoutLargeNodes(BVHN<4> *this,size_t num)

{
  NodeArea *pNVar1;
  NodeRef *pNVar2;
  ulong *puVar3;
  bool bVar4;
  long *plVar5;
  ThreadLocal2 *this_00;
  NodeRef NVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  size_t i;
  long lVar10;
  float fVar11;
  float fVar12;
  vector<NodeArea,_std::allocator<NodeArea>_> lst;
  Lock<embree::MutexSys> lock;
  vector<NodeArea,_std::allocator<NodeArea>_> local_88;
  _Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false> local_68;
  undefined1 local_60 [8];
  ThreadLocal *pTStack_58;
  ThreadLocal *local_50;
  MutexSys *local_48;
  char local_40;
  NodeRef *local_38;
  
  local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.super__Vector_impl_data.
  _M_start = (NodeArea *)0x0;
  local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.super__Vector_impl_data.
  _M_finish = (NodeArea *)0x0;
  local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (NodeArea *)0x0;
  std::vector<NodeArea,_std::allocator<NodeArea>_>::reserve(&local_88,num);
  local_60 = (undefined1  [8])&this->root;
  pTStack_58 = (ThreadLocal *)
               CONCAT44(pTStack_58._4_4_,
                        *(float *)(&DAT_01ff7028 + (ulong)(((this->root).ptr & 8) == 0) * 4));
  local_38 = (NodeRef *)local_60;
  if (local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<embree::BVHN<4>::layoutLargeNodes(unsigned_long)::NodeArea,std::allocator<embree::BVHN<4>::layoutLargeNodes(unsigned_long)::NodeArea>>
    ::_M_realloc_insert<embree::BVHN<4>::layoutLargeNodes(unsigned_long)::NodeArea>
              ((vector<embree::BVHN<4>::layoutLargeNodes(unsigned_long)::NodeArea,std::allocator<embree::BVHN<4>::layoutLargeNodes(unsigned_long)::NodeArea>>
                *)&local_88,
               (iterator)
               local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
               super__Vector_impl_data._M_finish,(NodeArea *)local_60);
  }
  else {
    (local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
     super__Vector_impl_data._M_finish)->node = (NodeRef *)local_60;
    *(ThreadLocal **)
     &(local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
       super__Vector_impl_data._M_finish)->A = pTStack_58;
    local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.super__Vector_impl_data
    ._M_finish = local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
  }
  do {
    if (num <= (ulong)((long)local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 4)) break;
    if (0x10 < (long)local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
                     super__Vector_impl_data._M_start) {
      pNVar2 = local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].node;
      fVar12 = local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].A;
      local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
      super__Vector_impl_data._M_finish[-1].node =
           (local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
            super__Vector_impl_data._M_start)->node;
      local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
      super__Vector_impl_data._M_finish[-1].A =
           (local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
            super__Vector_impl_data._M_start)->A;
      std::
      __adjust_heap<__gnu_cxx::__normal_iterator<embree::BVHN<4>::layoutLargeNodes(unsigned_long)::NodeArea*,std::vector<embree::BVHN<4>::layoutLargeNodes(unsigned_long)::NodeArea,std::allocator<embree::BVHN<4>::layoutLargeNodes(unsigned_long)::NodeArea>>>,long,embree::BVHN<4>::layoutLargeNodes(unsigned_long)::NodeArea,__gnu_cxx::__ops::_Iter_less_iter>
                (fVar12,local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
                        super__Vector_impl_data._M_start,0,
                 (long)local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
                       super__Vector_impl_data._M_finish +
                 (-0x10 - (long)local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 4,pNVar2);
    }
    pNVar1 = local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
    local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.super__Vector_impl_data
    ._M_finish = local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1;
    uVar9 = pNVar1->node->ptr;
    if ((uVar9 & 0xf) != 0) break;
    lVar10 = 0;
    do {
      if (*(long *)(uVar9 + lVar10 * 8) != 8) {
        local_60 = (undefined1  [8])(lVar10 * 8 + uVar9);
        fVar12 = -INFINITY;
        if (((ulong)((FastAllocator *)local_60)->device & 8) == 0) {
          fVar12 = *(float *)(uVar9 + 0x50 + lVar10 * 4) - *(float *)(uVar9 + 0x40 + lVar10 * 4);
          fVar11 = *(float *)(uVar9 + 0x70 + lVar10 * 4) - *(float *)(uVar9 + 0x60 + lVar10 * 4);
          fVar12 = (fVar12 + fVar11) *
                   (*(float *)(uVar9 + 0x30 + lVar10 * 4) - *(float *)(uVar9 + 0x20 + lVar10 * 4)) +
                   fVar11 * fVar12;
          fVar12 = fVar12 + fVar12;
        }
        pTStack_58 = (ThreadLocal *)CONCAT44(pTStack_58._4_4_,fVar12);
        if (local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<embree::BVHN<4>::layoutLargeNodes(unsigned_long)::NodeArea,std::allocator<embree::BVHN<4>::layoutLargeNodes(unsigned_long)::NodeArea>>
          ::_M_realloc_insert<embree::BVHN<4>::layoutLargeNodes(unsigned_long)::NodeArea>
                    ((vector<embree::BVHN<4>::layoutLargeNodes(unsigned_long)::NodeArea,std::allocator<embree::BVHN<4>::layoutLargeNodes(unsigned_long)::NodeArea>>
                      *)&local_88,
                     (iterator)
                     local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
                     super__Vector_impl_data._M_finish,(NodeArea *)local_60);
        }
        else {
          (local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
           super__Vector_impl_data._M_finish)->node = (NodeRef *)local_60;
          *(ThreadLocal **)
           &(local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
             super__Vector_impl_data._M_finish)->A = pTStack_58;
          local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        pNVar2 = local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1].node;
        fVar12 = local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1].A;
        lVar8 = (long)local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
                      super__Vector_impl_data._M_start >> 4;
        lVar7 = lVar8 + -1;
        if (1 < lVar8) {
          do {
            lVar8 = (lVar7 - (lVar7 + -1 >> 0x3f)) + -1 >> 1;
            if (fVar12 < local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar8].A ||
                fVar12 == local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar8].A) break;
            local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
            super__Vector_impl_data._M_start[lVar7].A =
                 local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar8].A;
            local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
            super__Vector_impl_data._M_start[lVar7].node =
                 local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar8].node;
            bVar4 = 2 < lVar7;
            lVar7 = lVar8;
          } while (bVar4);
        }
        local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
        super__Vector_impl_data._M_start[lVar7].node = pNVar2;
        local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
        super__Vector_impl_data._M_start[lVar7].A = fVar12;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 4);
  } while ((uVar9 & 0xf) == 0);
  pNVar2 = local_38;
  if (local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar10 = 0;
    uVar9 = 0;
    do {
      puVar3 = *(ulong **)
                ((long)&(local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
                         super__Vector_impl_data._M_start)->node + lVar10);
      *puVar3 = *puVar3 | 0x8000000000000000;
      uVar9 = uVar9 + 1;
      lVar10 = lVar10 + 0x10;
    } while (uVar9 < (ulong)((long)local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 4));
  }
  plVar5 = (long *)__tls_get_addr(&PTR_02224d38);
  this_00 = (ThreadLocal2 *)*plVar5;
  if (this_00 == (ThreadLocal2 *)0x0) {
    this_00 = (ThreadLocal2 *)alignedMalloc(0xc0,0x40);
    MutexSys::MutexSys((MutexSys *)this_00);
    (this_00->alloc)._M_b._M_p = (__pointer_type)0x0;
    (this_00->alloc0).parent = this_00;
    (this_00->alloc0).ptr = (char *)0x0;
    (this_00->alloc0).cur = 0;
    (this_00->alloc0).end = 0;
    (this_00->alloc0).allocBlockSize = 0;
    (this_00->alloc0).bytesUsed = 0;
    (this_00->alloc0).bytesWasted = 0;
    (this_00->alloc1).parent = this_00;
    (this_00->alloc1).ptr = (char *)0x0;
    (this_00->alloc1).cur = 0;
    (this_00->alloc1).end = 0;
    (this_00->alloc1).allocBlockSize = 0;
    (this_00->alloc1).bytesUsed = 0;
    (this_00->alloc1).bytesWasted = 0;
    *plVar5 = (long)this_00;
    local_48 = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
    local_40 = '\x01';
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    local_68._M_head_impl = this_00;
    std::
    vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
    ::
    emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
              ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                *)FastAllocator::s_thread_local_allocators,
               (unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                *)&local_68);
    if (local_68._M_head_impl != (ThreadLocal2 *)0x0) {
      std::default_delete<embree::FastAllocator::ThreadLocal2>::operator()
                ((default_delete<embree::FastAllocator::ThreadLocal2> *)&local_68,
                 local_68._M_head_impl);
    }
    if (local_40 == '\x01') {
      MutexSys::unlock(local_48);
    }
  }
  local_60 = (undefined1  [8])&this->alloc;
  pTStack_58 = &this_00->alloc0;
  local_50 = &this_00->alloc1;
  if ((this->alloc).use_single_mode != false) {
    local_50 = pTStack_58;
  }
  NVar6 = layoutLargeNodesRecursion(this,pNVar2,(CachedAllocator *)local_60);
  pNVar2->ptr = NVar6.ptr;
  if (local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
      super__Vector_impl_data._M_start != (NodeArea *)0x0) {
    ::operator_delete(local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
                      super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void BVHN<N>::layoutLargeNodes(size_t num)
  {
#if defined(__64BIT__) // do not use tree rotations on 32 bit platforms, barrier bit in NodeRef will cause issues
    struct NodeArea 
    {
      __forceinline NodeArea() {}

      __forceinline NodeArea(NodeRef& node, const BBox3fa& bounds)
        : node(&node), A(node.isLeaf() ? float(neg_inf) : area(bounds)) {}

      __forceinline bool operator< (const NodeArea& other) const {
        return this->A < other.A;
      }

      NodeRef* node;
      float A;
    };
    std::vector<NodeArea> lst;
    lst.reserve(num);
    lst.push_back(NodeArea(root,empty));

    while (lst.size() < num)
    {
      std::pop_heap(lst.begin(), lst.end());
      NodeArea n = lst.back(); lst.pop_back();
      if (!n.node->isAABBNode()) break;
      AABBNode* node = n.node->getAABBNode();
      for (size_t i=0; i<N; i++) {
        if (node->child(i) == BVHN::emptyNode) continue;
        lst.push_back(NodeArea(node->child(i),node->bounds(i)));
        std::push_heap(lst.begin(), lst.end());
      }
    }

    for (size_t i=0; i<lst.size(); i++)
      lst[i].node->setBarrier();
      
    root = layoutLargeNodesRecursion(root,alloc.getCachedAllocator());
#endif
  }